

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void make_inner_chamber_wall(chunk_conflict *c,wchar_t y,wchar_t x)

{
  _Bool _Var1;
  loc_conflict grid_00;
  square_conflict *psVar2;
  loc grid;
  wchar_t x_local;
  wchar_t y_local;
  chunk_conflict *c_local;
  
  grid_00 = (loc_conflict)loc(x,y);
  psVar2 = square((chunk *)c,grid_00);
  if ((((psVar2->feat == '\x15') || (psVar2 = square((chunk *)c,grid_00), psVar2->feat == '\x11'))
      && (_Var1 = square_iswall_outer((chunk *)c,grid_00), !_Var1)) &&
     (_Var1 = square_iswall_solid((chunk *)c,grid_00), !_Var1)) {
    set_marked_granite(c,(loc)grid_00,L'\v');
  }
  return;
}

Assistant:

static void make_inner_chamber_wall(struct chunk *c, int y, int x)
{
	struct loc grid = loc(x, y);
	if ((square(c, grid)->feat != FEAT_GRANITE) &&
		(square(c, grid)->feat != FEAT_MAGMA))
		return;
	if (square_iswall_outer(c, grid)) return;
	if (square_iswall_solid(c, grid)) return;
	set_marked_granite(c, grid, SQUARE_WALL_INNER);
}